

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Contains::~Contains(Contains *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Contains_001f1378;
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~MatcherImpl((MatcherImpl<Catch::Matchers::Impl::StdString::Contains,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x17e9b4);
  return;
}

Assistant:

Matchers::Impl::StdString::Contains::~Contains() {}